

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O0

ngram_model_t * ngram_model_set_interp(ngram_model_t *base,char **names,float32 *weights)

{
  int iVar1;
  int local_38;
  int local_34;
  int32 j;
  int32 i;
  ngram_model_set_t *set;
  float32 *weights_local;
  char **names_local;
  ngram_model_t *base_local;
  
  if ((names == (char **)0x0) || (weights == (float32 *)0x0)) {
    if (weights != (float32 *)0x0) {
      memcpy(*(void **)&base[1].n,weights,(long)base[1].refcount << 2);
    }
  }
  else {
    for (local_34 = 0; local_34 < base[1].refcount; local_34 = local_34 + 1) {
      local_38 = 0;
      while ((local_38 < base[1].refcount &&
             (iVar1 = strcmp(names[local_34],
                             *(char **)(*(long *)&base[1].n_1g_alloc + (long)local_38 * 8)),
             iVar1 != 0))) {
        local_38 = local_38 + 1;
      }
      if (local_38 == base[1].refcount) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                ,0x1fd,"Unknown LM name %s\n",names[local_34]);
        return (ngram_model_t *)0x0;
      }
      iVar1 = logmath_log(base->lmath,(float64)(double)(float)weights[local_34]);
      *(int *)(*(long *)&base[1].n + (long)local_38 * 4) = iVar1;
    }
  }
  *(undefined4 *)&base[1].field_0x4 = 0xffffffff;
  return base;
}

Assistant:

ngram_model_t *
ngram_model_set_interp(ngram_model_t * base,
                       const char **names, const float32 * weights)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;

    /* If we have a set of weights here, then set them. */
    if (names && weights) {
        int32 i, j;

        /* We hope there aren't many models. */
        for (i = 0; i < set->n_models; ++i) {
            for (j = 0; j < set->n_models; ++j)
                if (0 == strcmp(names[i], set->names[j]))
                    break;
            if (j == set->n_models) {
                E_ERROR("Unknown LM name %s\n", names[i]);
                return NULL;
            }
            set->lweights[j] = logmath_log(base->lmath, weights[i]);
        }
    }
    else if (weights) {
        memcpy(set->lweights, weights,
               set->n_models * sizeof(*set->lweights));
    }
    /* Otherwise just enable existing weights. */
    set->cur = -1;
    return base;
}